

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageStoreCase::iterate(ImageStoreCase *this)

{
  pointer *pppSVar1;
  deUint32 *pdVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ChannelType CVar4;
  TextureType TVar5;
  ChannelType CVar6;
  TestLog *pTVar7;
  bool bVar8;
  ImageStoreCase *pIVar9;
  undefined4 uVar10;
  bool bVar11;
  int iVar12;
  deUint32 dVar13;
  int iVar14;
  ContextType type;
  GLSLVersion version;
  int iVar15;
  deUint32 dVar16;
  uint uVar17;
  uint uVar18;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar19;
  undefined4 extraout_var_01;
  size_t sVar20;
  long *plVar21;
  undefined8 *puVar22;
  char *pcVar23;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined8 uVar24;
  uint uVar25;
  size_type *psVar26;
  Functions *pFVar27;
  RenderContext *renderContext;
  long *plVar28;
  ulong *puVar29;
  uint uVar30;
  uint uVar31;
  bool *__s;
  long lVar32;
  uint x;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 isSampler;
  GLuint x_00;
  uint uVar36;
  uint y;
  GLenum target;
  uint z;
  bool bVar37;
  float fVar38;
  GLuint local_6ac;
  IVec3 local_6a8;
  RenderContext *local_698;
  ulong local_690;
  string glslVersionDeclaration;
  Vector<float,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_658 [2];
  ImageStoreCase *local_638;
  string colorExpr;
  ulong *local_610;
  long local_608;
  ulong local_600;
  long lStack_5f8;
  ulong *local_5f0;
  long local_5e8;
  ulong local_5e0;
  long lStack_5d8;
  long *local_5d0;
  undefined8 local_5c8;
  long local_5c0;
  undefined8 uStack_5b8;
  TestLog *local_5b0;
  undefined1 local_5a8 [8];
  float fStack_5a0;
  float fStack_59c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  ulong *local_578;
  long local_570;
  ulong local_568;
  undefined8 uStack_560;
  ulong *local_558;
  long local_550;
  ulong local_548;
  long lStack_540;
  ulong *local_538;
  long local_530;
  ulong local_528;
  long lStack_520;
  ulong *local_518;
  long local_510;
  ulong local_508;
  long lStack_500;
  ulong *local_4f8;
  long local_4f0;
  ulong local_4e8;
  long lStack_4e0;
  long *local_4d8;
  undefined8 local_4d0;
  long local_4c8;
  undefined8 uStack_4c0;
  ulong *local_4b8;
  long local_4b0;
  ulong local_4a8;
  long lStack_4a0;
  CallLogWrapper glLog;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_460;
  undefined8 local_458;
  long local_450;
  undefined8 uStack_448;
  TextureFormat *local_440;
  ulong local_438;
  string colorBaseExpr;
  Texture texture;
  string local_3e0;
  long *local_3c0;
  long local_3b8;
  long local_3b0;
  long lStack_3a8;
  long *local_3a0;
  long local_398;
  long local_390;
  long lStack_388;
  long *local_380;
  long local_378;
  long local_370;
  long lStack_368;
  long *local_360;
  long local_358;
  long local_350;
  long lStack_348;
  long *local_340;
  long local_338;
  long local_330;
  long lStack_328;
  long *local_320;
  long local_318;
  long local_310;
  long lStack_308;
  string shaderImageTypeStr;
  long *local_2e0;
  long local_2d8;
  long local_2d0;
  long lStack_2c8;
  Buffer textureBuf;
  UniformAccessLogger uniforms;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_218;
  undefined1 local_1f8 [40];
  string shaderImageFormatStr;
  ShaderProgram program;
  
  local_698 = ((this->super_TestCase).m_context)->m_renderCtx;
  pTVar7 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar12 = (*local_698->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper(&glLog,(Functions *)CONCAT44(extraout_var,iVar12),pTVar7);
  dVar13 = glu::getInternalFormat(this->m_format);
  switch(this->m_textureType) {
  case TEXTURETYPE_2D:
    local_6a8.m_data[0] = 0x40;
    local_6a8.m_data[1] = 0x40;
    target = 0xde1;
    iVar12 = 0x40;
    goto LAB_014712dd;
  case TEXTURETYPE_CUBE:
    local_6a8.m_data[0] = 0x40;
    local_6a8.m_data[1] = 0x40;
    local_6a8.m_data[2] = 1;
    local_6ac = 6;
    bVar11 = true;
    target = 0x8513;
    iVar12 = 0x40;
    iVar14 = 1;
    iVar15 = 0x40;
    break;
  case TEXTURETYPE_2D_ARRAY:
    target = 0x8c1a;
    goto LAB_01471292;
  case TEXTURETYPE_3D:
    target = 0x806f;
LAB_01471292:
    local_6a8.m_data[2] = 8;
    local_6a8.m_data[0] = 0x40;
    local_6a8.m_data[1] = 0x40;
    bVar11 = true;
    iVar12 = 0x40;
    iVar14 = 8;
    iVar15 = 0x40;
    local_6ac = 8;
    break;
  default:
    local_6a8.m_data[2] = -1;
    local_6a8.m_data[0] = -1;
    local_6a8.m_data[1] = -1;
    iVar14 = -1;
    bVar11 = false;
    iVar12 = -1;
    iVar15 = -1;
    target = 0xffffffff;
    local_6ac = 0xffffffff;
    break;
  case TEXTURETYPE_BUFFER:
    local_6a8.m_data[0] = 0x40;
    local_6a8.m_data[1] = 1;
    target = 0x8c2a;
    iVar12 = 1;
LAB_014712dd:
    local_6a8.m_data[2] = 1;
    bVar11 = true;
    iVar15 = 0x40;
    iVar14 = 1;
    local_6ac = 1;
  }
  if (iVar14 < iVar12) {
    iVar14 = iVar12;
  }
  if (iVar14 < iVar15) {
    iVar14 = iVar15;
  }
  CVar4 = (this->m_format).type;
  if ((CVar4 < UNORM_BYTE_44) && ((0x58U >> (CVar4 & UNSIGNED_INT16) & 1) != 0)) {
    fVar38 = 1.0;
LAB_01471319:
    _local_5a8 = ZEXT416((uint)(fVar38 / (float)(iVar14 + -1)));
  }
  else {
    if (CVar4 < UNORM_INT8) {
      fVar38 = 2.0;
      goto LAB_01471319;
    }
    _local_5a8 = ZEXT816(0x3f800000);
  }
  if (CVar4 < UNORM_INT8) {
    fVar38 = -1.0;
  }
  else {
    fVar38 = 0.0;
  }
  iVar12 = (*local_698->_vptr_RenderContext[3])();
  pOVar19 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&textureBuf.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar12),pOVar19);
  iVar12 = (*local_698->_vptr_RenderContext[3])();
  pOVar19 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&texture.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_01,iVar12),pOVar19);
  glLog.m_enableLog = true;
  pppSVar1 = &program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = SUB84(pTVar7,0);
  uVar10 = program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start._0_4_;
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start._4_4_ = (deUint32)((ulong)pTVar7 >> 0x20);
  dVar16 = program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
           _M_impl.super__Vector_impl_data._M_start._4_4_;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)pppSVar1,"// Created a texture (name ",0x1b);
  std::ostream::_M_insert<unsigned_long>((ulong)pppSVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pppSVar1,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
  std::ios_base::~ios_base((ios_base *)(program.m_shaders + 5));
  if (this->m_textureType == TEXTURETYPE_BUFFER) {
    pppSVar1 = &program.m_shaders[0].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = uVar10;
    program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = dVar16;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pppSVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pppSVar1,"// Created a buffer for the texture (name ",0x2a);
    std::ostream::_M_insert<unsigned_long>((ulong)pppSVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pppSVar1,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&program,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pppSVar1);
    std::ios_base::~ios_base((ios_base *)(program.m_shaders + 5));
  }
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c0);
  glu::CallLogWrapper::glBindTexture(&glLog,target,texture.super_ObjectWrapper.m_object);
  setTexParameteri(&glLog,target);
  isSampler = (undefined1)textureBuf.super_ObjectWrapper.m_object;
  setTextureStorage(&glLog,this->m_textureType,dVar13,&local_6a8,
                    textureBuf.super_ObjectWrapper.m_object);
  getShaderImageFormatQualifier_abi_cxx11_
            (&shaderImageFormatStr,(Functional *)(ulong)(this->m_format).order,
             (TextureFormat *)(ulong)(this->m_format).type);
  TVar5 = this->m_textureType;
  uVar35 = (ulong)TVar5;
  if ((this->m_singleLayerBind == true) && (uVar35 = 8, TVar5 < TEXTURETYPE_LAST)) {
    uVar35 = (ulong)*(uint *)(&DAT_01c5a638 + (ulong)TVar5 * 4);
  }
  local_5b0 = pTVar7;
  getShaderSamplerOrImageType_abi_cxx11_
            (&shaderImageTypeStr,(Functional *)(ulong)(this->m_format).type,(ChannelType)uVar35,
             TEXTURETYPE_2D,(bool)isSampler);
  CVar6 = (this->m_format).type;
  __s = (bool *)0x1c4c531;
  if (2 < CVar6 - SIGNED_INT8) {
    __s = ::glcts::fixed_sample_locations_values + 1;
  }
  if ((CVar6 & ~SNORM_INT16) == UNSIGNED_INT8) {
    __s = (bool *)0x1adf404;
  }
  if (CVar6 == UNSIGNED_INT32) {
    __s = (bool *)0x1adf404;
  }
  local_5d0 = &local_5c0;
  sVar20 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,__s,__s + sVar20);
  plVar21 = (long *)std::__cxx11::string::append((char *)&local_5d0);
  puVar29 = (ulong *)(plVar21 + 2);
  if ((ulong *)*plVar21 == puVar29) {
    local_600 = *puVar29;
    lStack_5f8 = plVar21[3];
    local_610 = &local_600;
  }
  else {
    local_600 = *puVar29;
    local_610 = (ulong *)*plVar21;
  }
  local_608 = plVar21[1];
  *plVar21 = (long)puVar29;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  iVar12 = local_6a8.m_data[0];
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program);
  std::ostream::operator<<(&program,iVar12 + -1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program);
  std::ios_base::~ios_base
            ((ios_base *)
             &program.m_shaders[4].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar34 = 0xf;
  if (local_610 != &local_600) {
    uVar34 = local_600;
  }
  if (uVar34 < (ulong)(local_5e8 + local_608)) {
    uVar34 = 0xf;
    if (local_5f0 != &local_5e0) {
      uVar34 = local_5e0;
    }
    if (uVar34 < (ulong)(local_5e8 + local_608)) goto LAB_014716d7;
    puVar22 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_5f0,0,(char *)0x0,(ulong)local_610);
  }
  else {
LAB_014716d7:
    puVar22 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_610,(ulong)local_5f0);
  }
  local_4d8 = &local_4c8;
  plVar21 = puVar22 + 2;
  if ((long *)*puVar22 == plVar21) {
    local_4c8 = *plVar21;
    uStack_4c0 = puVar22[3];
  }
  else {
    local_4c8 = *plVar21;
    local_4d8 = (long *)*puVar22;
  }
  local_4d0 = puVar22[1];
  *puVar22 = plVar21;
  puVar22[1] = 0;
  *(undefined1 *)plVar21 = 0;
  plVar21 = (long *)std::__cxx11::string::append((char *)&local_4d8);
  puVar29 = (ulong *)(plVar21 + 2);
  if ((ulong *)*plVar21 == puVar29) {
    local_4e8 = *puVar29;
    lStack_4e0 = plVar21[3];
    local_4f8 = &local_4e8;
  }
  else {
    local_4e8 = *puVar29;
    local_4f8 = (ulong *)*plVar21;
  }
  local_4f0 = plVar21[1];
  *plVar21 = (long)puVar29;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  iVar14 = local_6a8.m_data[1];
  local_638 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program);
  std::ostream::operator<<(&program,iVar14 + -1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program);
  std::ios_base::~ios_base
            ((ios_base *)
             &program.m_shaders[4].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar34 = 0xf;
  if (local_4f8 != &local_4e8) {
    uVar34 = local_4e8;
  }
  if (uVar34 < (ulong)(local_510 + local_4f0)) {
    uVar34 = 0xf;
    if (local_518 != &local_508) {
      uVar34 = local_508;
    }
    if (uVar34 < (ulong)(local_510 + local_4f0)) goto LAB_0147188a;
    puVar22 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_518,0,(char *)0x0,(ulong)local_4f8);
  }
  else {
LAB_0147188a:
    puVar22 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4f8,(ulong)local_518);
  }
  glslVersionDeclaration._M_dataplus._M_p = (pointer)&glslVersionDeclaration.field_2;
  psVar26 = puVar22 + 2;
  if ((size_type *)*puVar22 == psVar26) {
    glslVersionDeclaration.field_2._M_allocated_capacity = *psVar26;
    glslVersionDeclaration.field_2._8_8_ = puVar22[3];
  }
  else {
    glslVersionDeclaration.field_2._M_allocated_capacity = *psVar26;
    glslVersionDeclaration._M_dataplus._M_p = (pointer)*puVar22;
  }
  glslVersionDeclaration._M_string_length = puVar22[1];
  *puVar22 = psVar26;
  puVar22[1] = 0;
  *(char *)psVar26 = '\0';
  local_690 = uVar35;
  plVar21 = (long *)std::__cxx11::string::append((char *)&glslVersionDeclaration);
  puVar29 = (ulong *)(plVar21 + 2);
  if ((ulong *)*plVar21 == puVar29) {
    local_4a8 = *puVar29;
    lStack_4a0 = plVar21[3];
    local_4b8 = &local_4a8;
  }
  else {
    local_4a8 = *puVar29;
    local_4b8 = (ulong *)*plVar21;
  }
  local_4b0 = plVar21[1];
  *plVar21 = (long)puVar29;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program);
  std::ostream::operator<<(&program,iVar12 + -1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program);
  std::ios_base::~ios_base
            ((ios_base *)
             &program.m_shaders[4].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar35 = 0xf;
  if (local_4b8 != &local_4a8) {
    uVar35 = local_4a8;
  }
  if (uVar35 < (ulong)(local_530 + local_4b0)) {
    uVar35 = 0xf;
    if (local_538 != &local_528) {
      uVar35 = local_528;
    }
    if (uVar35 < (ulong)(local_530 + local_4b0)) goto LAB_01471a06;
    puVar22 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_538,0,(char *)0x0,(ulong)local_4b8);
  }
  else {
LAB_01471a06:
    puVar22 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_4b8,(ulong)local_538);
  }
  colorExpr._M_dataplus._M_p = (pointer)&colorExpr.field_2;
  psVar26 = puVar22 + 2;
  if ((size_type *)*puVar22 == psVar26) {
    colorExpr.field_2._M_allocated_capacity = *psVar26;
    colorExpr.field_2._8_8_ = puVar22[3];
  }
  else {
    colorExpr.field_2._M_allocated_capacity = *psVar26;
    colorExpr._M_dataplus._M_p = (pointer)*puVar22;
  }
  colorExpr._M_string_length = puVar22[1];
  *puVar22 = psVar26;
  puVar22[1] = 0;
  *(char *)psVar26 = '\0';
  plVar21 = (long *)std::__cxx11::string::append((char *)&colorExpr);
  puVar29 = (ulong *)(plVar21 + 2);
  if ((ulong *)*plVar21 == puVar29) {
    local_658[0]._0_8_ = *puVar29;
    local_658[0]._8_8_ = plVar21[3];
    res.m_data._0_8_ = local_658;
  }
  else {
    local_658[0]._0_8_ = *puVar29;
    res.m_data._0_8_ = (ulong *)*plVar21;
  }
  res.m_data._8_8_ = plVar21[1];
  *plVar21 = (long)puVar29;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program);
  std::ostream::operator<<(&program,iVar14 + -1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program);
  std::ios_base::~ios_base
            ((ios_base *)
             &program.m_shaders[4].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  uVar24 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res.m_data._0_8_ != local_658) {
    uVar24 = local_658[0]._M_allocated_capacity;
  }
  if ((ulong)uVar24 < (ulong)(local_550 + res.m_data._8_8_)) {
    uVar35 = 0xf;
    if (local_558 != &local_548) {
      uVar35 = local_548;
    }
    if (uVar35 < (ulong)(local_550 + res.m_data._8_8_)) goto LAB_01471b77;
    plVar21 = (long *)std::__cxx11::string::replace
                                ((ulong)&local_558,0,(char *)0x0,res.m_data._0_8_);
  }
  else {
LAB_01471b77:
    plVar21 = (long *)std::__cxx11::string::_M_append((char *)&res,(ulong)local_558);
  }
  uniforms.m_gl = (Functions *)&uniforms.m_programGL;
  pFVar27 = (Functions *)(plVar21 + 2);
  if ((Functions *)*plVar21 == pFVar27) {
    uniforms._16_8_ = pFVar27->activeShaderProgram;
    uniforms.m_uniformLocations._M_t._M_impl._0_8_ = plVar21[3];
  }
  else {
    uniforms._16_8_ = pFVar27->activeShaderProgram;
    uniforms.m_gl = (Functions *)*plVar21;
  }
  uniforms.m_log = (TestLog *)plVar21[1];
  *plVar21 = (long)pFVar27;
  plVar21[1] = 0;
  *(undefined1 *)&pFVar27->activeShaderProgram = 0;
  plVar21 = (long *)std::__cxx11::string::append((char *)&uniforms);
  colorBaseExpr._M_dataplus._M_p = (pointer)&colorBaseExpr.field_2;
  psVar26 = (size_type *)(plVar21 + 2);
  if ((size_type *)*plVar21 == psVar26) {
    colorBaseExpr.field_2._M_allocated_capacity = *psVar26;
    colorBaseExpr.field_2._8_8_ = plVar21[3];
  }
  else {
    colorBaseExpr.field_2._M_allocated_capacity = *psVar26;
    colorBaseExpr._M_dataplus._M_p = (pointer)*plVar21;
  }
  colorBaseExpr._M_string_length = plVar21[1];
  *plVar21 = (long)psVar26;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  pdVar2 = &uniforms.m_programGL;
  if (uniforms.m_gl != (Functions *)pdVar2) {
    operator_delete(uniforms.m_gl,uniforms._16_8_ + 1);
  }
  if (local_558 != &local_548) {
    operator_delete(local_558,local_548 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res.m_data._0_8_ != local_658) {
    operator_delete((void *)res.m_data._0_8_,local_658[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorExpr._M_dataplus._M_p != &colorExpr.field_2) {
    operator_delete(colorExpr._M_dataplus._M_p,colorExpr.field_2._M_allocated_capacity + 1);
  }
  if (local_538 != &local_528) {
    operator_delete(local_538,local_528 + 1);
  }
  if (local_4b8 != &local_4a8) {
    operator_delete(local_4b8,local_4a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
    operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                    glslVersionDeclaration.field_2._M_allocated_capacity + 1);
  }
  if (local_518 != &local_508) {
    operator_delete(local_518,local_508 + 1);
  }
  if (local_4f8 != &local_4e8) {
    operator_delete(local_4f8,local_4e8 + 1);
  }
  if (local_4d8 != &local_4c8) {
    operator_delete(local_4d8,local_4c8 + 1);
  }
  if (local_5f0 != &local_5e0) {
    operator_delete(local_5f0,local_5e0 + 1);
  }
  if (local_610 != &local_600) {
    operator_delete(local_610,local_600 + 1);
  }
  if (local_5d0 != &local_5c0) {
    operator_delete(local_5d0,local_5c0 + 1);
  }
  if (((float)local_5a8._0_4_ != 1.0) || (NAN((float)local_5a8._0_4_))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&program);
    std::ostream::_M_insert<double>((double)(float)local_5a8._0_4_);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program);
    std::ios_base::~ios_base
              ((ios_base *)
               &program.m_shaders[4].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    plVar21 = (long *)std::__cxx11::string::replace((ulong)&local_4b8,0,(char *)0x0,0x1bff8b2);
    res.m_data._0_8_ = local_658;
    puVar29 = (ulong *)(plVar21 + 2);
    if ((ulong *)*plVar21 == puVar29) {
      local_658[0]._0_8_ = *puVar29;
      local_658[0]._8_8_ = plVar21[3];
    }
    else {
      local_658[0]._0_8_ = *puVar29;
      res.m_data._0_8_ = (ulong *)*plVar21;
    }
    res.m_data._8_8_ = plVar21[1];
    *plVar21 = (long)puVar29;
    plVar21[1] = 0;
    *(undefined1 *)(plVar21 + 2) = 0;
  }
  else {
    res.m_data._0_8_ = local_658;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  plVar21 = (long *)std::__cxx11::string::replace
                              ((ulong)&res,0,(char *)0x0,(ulong)colorBaseExpr._M_dataplus._M_p);
  pFVar27 = (Functions *)(plVar21 + 2);
  if ((Functions *)*plVar21 == pFVar27) {
    uniforms._16_8_ = pFVar27->activeShaderProgram;
    uniforms.m_uniformLocations._M_t._M_impl._0_8_ = plVar21[3];
    uniforms.m_gl = (Functions *)pdVar2;
  }
  else {
    uniforms._16_8_ = pFVar27->activeShaderProgram;
    uniforms.m_gl = (Functions *)*plVar21;
  }
  uniforms.m_log = (TestLog *)plVar21[1];
  *plVar21 = (long)pFVar27;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  if (CVar4 < UNORM_INT8) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&program);
    std::ostream::_M_insert<double>(-1.0);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&program);
    std::ios_base::~ios_base
              ((ios_base *)
               &program.m_shaders[4].
                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    plVar21 = (long *)std::__cxx11::string::replace((ulong)&local_4d8,0,(char *)0x0,0x1c58bb3);
    puVar29 = (ulong *)(plVar21 + 2);
    if ((ulong *)*plVar21 == puVar29) {
      local_4e8 = *puVar29;
      lStack_4e0 = plVar21[3];
      local_4f8 = &local_4e8;
    }
    else {
      local_4e8 = *puVar29;
      local_4f8 = (ulong *)*plVar21;
    }
    local_4f0 = plVar21[1];
    *plVar21 = (long)puVar29;
    plVar21[1] = 0;
    *(undefined1 *)(plVar21 + 2) = 0;
    plVar21 = (long *)std::__cxx11::string::append((char *)&local_4f8);
    glslVersionDeclaration._M_dataplus._M_p = (pointer)&glslVersionDeclaration.field_2;
    psVar26 = (size_type *)(plVar21 + 2);
    if ((size_type *)*plVar21 == psVar26) {
      glslVersionDeclaration.field_2._M_allocated_capacity = *psVar26;
      glslVersionDeclaration.field_2._8_8_ = plVar21[3];
    }
    else {
      glslVersionDeclaration.field_2._M_allocated_capacity = *psVar26;
      glslVersionDeclaration._M_dataplus._M_p = (pointer)*plVar21;
    }
    glslVersionDeclaration._M_string_length = plVar21[1];
    *plVar21 = (long)psVar26;
    plVar21[1] = 0;
    *(undefined1 *)(plVar21 + 2) = 0;
  }
  else {
    glslVersionDeclaration._M_dataplus._M_p = (pointer)&glslVersionDeclaration.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&glslVersionDeclaration,0x1af8059);
  }
  uVar35 = (long)&(uniforms.m_log)->m_log + glslVersionDeclaration._M_string_length;
  uVar34 = 0xf;
  if (uniforms.m_gl != (Functions *)pdVar2) {
    uVar34 = uniforms._16_8_;
  }
  if (uVar34 < uVar35) {
    uVar24 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
      uVar24 = glslVersionDeclaration.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar24 < uVar35) goto LAB_014720da;
    plVar21 = (long *)std::__cxx11::string::replace
                                ((ulong)&glslVersionDeclaration,0,(char *)0x0,(ulong)uniforms.m_gl);
  }
  else {
LAB_014720da:
    plVar21 = (long *)std::__cxx11::string::_M_append
                                ((char *)&uniforms,(ulong)glslVersionDeclaration._M_dataplus._M_p);
  }
  colorExpr._M_dataplus._M_p = (pointer)&colorExpr.field_2;
  renderContext = (RenderContext *)(plVar21 + 2);
  if ((RenderContext *)*plVar21 == renderContext) {
    colorExpr.field_2._M_allocated_capacity = (size_type)renderContext->_vptr_RenderContext;
    colorExpr.field_2._8_8_ = plVar21[3];
  }
  else {
    colorExpr.field_2._M_allocated_capacity = (size_type)renderContext->_vptr_RenderContext;
    colorExpr._M_dataplus._M_p = (pointer)*plVar21;
  }
  colorExpr._M_string_length = plVar21[1];
  *plVar21 = (long)renderContext;
  plVar21[1] = 0;
  *(undefined1 *)&renderContext->_vptr_RenderContext = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
    operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                    glslVersionDeclaration.field_2._M_allocated_capacity + 1);
  }
  if (CVar4 < UNORM_INT8) {
    if (local_4f8 != &local_4e8) {
      operator_delete(local_4f8,local_4e8 + 1);
    }
    if (local_4d8 != &local_4c8) {
      operator_delete(local_4d8,local_4c8 + 1);
    }
  }
  if (uniforms.m_gl != (Functions *)pdVar2) {
    operator_delete(uniforms.m_gl,uniforms._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res.m_data._0_8_ != local_658) {
    operator_delete((void *)res.m_data._0_8_,local_658[0]._M_allocated_capacity + 1);
  }
  if ((((float)local_5a8._0_4_ != 1.0) || (NAN((float)local_5a8._0_4_))) &&
     (local_4b8 != &local_4a8)) {
    operator_delete(local_4b8,local_4a8 + 1);
  }
  type.super_ApiType.m_bits = (ApiType)(*local_698->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  pcVar23 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDeclaration,pcVar23,(allocator<char> *)&program);
  uVar35 = local_690;
  memset(&uniforms,0,0xac);
  local_1f8._0_8_ = (pointer)0x0;
  local_1f8[8] = 0;
  local_1f8._9_7_ = 0;
  local_1f8[0x10] = 0;
  local_1f8._17_8_ = 0;
  paVar3 = &__str.field_2;
  __str._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__str,glslVersionDeclaration._M_dataplus._M_p,
             glslVersionDeclaration._M_dataplus._M_p + glslVersionDeclaration._M_string_length);
  std::__cxx11::string::append((char *)&__str);
  iVar12 = (int)uVar35;
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_3e0,(Functional *)(uVar35 & 0xffffffff),(TextureType)local_698,renderContext);
  uVar24 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar3) {
    uVar24 = __str.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar24 < local_3e0._M_string_length + __str._M_string_length) {
    uVar24 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      uVar24 = local_3e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar24 < local_3e0._M_string_length + __str._M_string_length) goto LAB_0147231e;
    puVar22 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_3e0,0,(char *)0x0,(ulong)__str._M_dataplus._M_p);
  }
  else {
LAB_0147231e:
    puVar22 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&__str,(ulong)local_3e0._M_dataplus._M_p);
  }
  local_460 = &local_450;
  plVar21 = puVar22 + 2;
  if ((long *)*puVar22 == plVar21) {
    local_450 = *plVar21;
    uStack_448 = puVar22[3];
  }
  else {
    local_450 = *plVar21;
    local_460 = (long *)*puVar22;
  }
  local_458 = puVar22[1];
  *puVar22 = plVar21;
  puVar22[1] = 0;
  *(undefined1 *)plVar21 = 0;
  plVar21 = (long *)std::__cxx11::string::append((char *)&local_460);
  plVar28 = plVar21 + 2;
  if ((long *)*plVar21 == plVar28) {
    local_2d0 = *plVar28;
    lStack_2c8 = plVar21[3];
    local_2e0 = &local_2d0;
  }
  else {
    local_2d0 = *plVar28;
    local_2e0 = (long *)*plVar21;
  }
  local_2d8 = plVar21[1];
  *plVar21 = (long)plVar28;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  plVar21 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_2e0,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_3c0 = &local_3b0;
  plVar28 = plVar21 + 2;
  if ((long *)*plVar21 == plVar28) {
    local_3b0 = *plVar28;
    lStack_3a8 = plVar21[3];
  }
  else {
    local_3b0 = *plVar28;
    local_3c0 = (long *)*plVar21;
  }
  local_3b8 = plVar21[1];
  *plVar21 = (long)plVar28;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  plVar21 = (long *)std::__cxx11::string::append((char *)&local_3c0);
  local_3a0 = &local_390;
  plVar28 = plVar21 + 2;
  if ((long *)*plVar21 == plVar28) {
    local_390 = *plVar28;
    lStack_388 = plVar21[3];
  }
  else {
    local_390 = *plVar28;
    local_3a0 = (long *)*plVar21;
  }
  local_398 = plVar21[1];
  *plVar21 = (long)plVar28;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  plVar21 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_3a0,(ulong)shaderImageFormatStr._M_dataplus._M_p);
  local_380 = &local_370;
  plVar28 = plVar21 + 2;
  if ((long *)*plVar21 == plVar28) {
    local_370 = *plVar28;
    lStack_368 = plVar21[3];
  }
  else {
    local_370 = *plVar28;
    local_380 = (long *)*plVar21;
  }
  local_378 = plVar21[1];
  *plVar21 = (long)plVar28;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  plVar21 = (long *)std::__cxx11::string::append((char *)&local_380);
  local_360 = &local_350;
  plVar28 = plVar21 + 2;
  if ((long *)*plVar21 == plVar28) {
    local_350 = *plVar28;
    lStack_348 = plVar21[3];
  }
  else {
    local_350 = *plVar28;
    local_360 = (long *)*plVar21;
  }
  local_358 = plVar21[1];
  *plVar21 = (long)plVar28;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  plVar21 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_360,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_340 = &local_330;
  plVar28 = plVar21 + 2;
  if ((long *)*plVar21 == plVar28) {
    local_330 = *plVar28;
    lStack_328 = plVar21[3];
  }
  else {
    local_330 = *plVar28;
    local_340 = (long *)*plVar21;
  }
  local_338 = plVar21[1];
  *plVar21 = (long)plVar28;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  plVar21 = (long *)std::__cxx11::string::append((char *)&local_340);
  local_320 = &local_310;
  plVar28 = plVar21 + 2;
  if ((long *)*plVar21 == plVar28) {
    local_310 = *plVar28;
    lStack_308 = plVar21[3];
  }
  else {
    local_310 = *plVar28;
    local_320 = (long *)*plVar21;
  }
  local_318 = plVar21[1];
  *plVar21 = (long)plVar28;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  plVar21 = (long *)std::__cxx11::string::append((char *)&local_320);
  local_558 = &local_548;
  puVar29 = (ulong *)(plVar21 + 2);
  if ((ulong *)*plVar21 == puVar29) {
    local_548 = *puVar29;
    lStack_540 = plVar21[3];
  }
  else {
    local_548 = *puVar29;
    local_558 = (ulong *)*plVar21;
  }
  local_550 = plVar21[1];
  *plVar21 = (long)puVar29;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  plVar21 = (long *)std::__cxx11::string::append((char *)&local_558);
  local_538 = &local_528;
  puVar29 = (ulong *)(plVar21 + 2);
  if ((ulong *)*plVar21 == puVar29) {
    local_528 = *puVar29;
    lStack_520 = plVar21[3];
  }
  else {
    local_528 = *puVar29;
    local_538 = (ulong *)*plVar21;
  }
  local_530 = plVar21[1];
  *plVar21 = (long)puVar29;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  plVar21 = (long *)std::__cxx11::string::append((char *)&local_538);
  local_518 = &local_508;
  puVar29 = (ulong *)(plVar21 + 2);
  if ((ulong *)*plVar21 == puVar29) {
    local_508 = *puVar29;
    lStack_500 = plVar21[3];
  }
  else {
    local_508 = *puVar29;
    local_518 = (ulong *)*plVar21;
  }
  local_510 = plVar21[1];
  *plVar21 = (long)puVar29;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  plVar21 = (long *)std::__cxx11::string::append((char *)&local_518);
  puVar29 = (ulong *)(plVar21 + 2);
  if ((ulong *)*plVar21 == puVar29) {
    local_5e0 = *puVar29;
    lStack_5d8 = plVar21[3];
    local_5f0 = &local_5e0;
  }
  else {
    local_5e0 = *puVar29;
    local_5f0 = (ulong *)*plVar21;
  }
  local_5e8 = plVar21[1];
  *plVar21 = (long)puVar29;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  if (iVar12 == 7) {
    std::operator+(&local_598,"\timageStore(u_image, gx, ",&colorExpr);
    puVar22 = (undefined8 *)std::__cxx11::string::append((char *)&local_598);
    local_578 = &local_568;
    puVar29 = puVar22 + 2;
    if ((ulong *)*puVar22 == puVar29) {
      local_568 = *puVar29;
      uStack_560 = puVar22[3];
    }
    else {
      local_568 = *puVar29;
      local_578 = (ulong *)*puVar22;
    }
    local_570 = puVar22[1];
    *puVar22 = puVar29;
    bVar37 = false;
LAB_0147290b:
    bVar8 = false;
  }
  else {
    if (2 < iVar12 - 1U) {
      if (iVar12 != 0) {
        local_578 = &local_568;
        uVar24 = std::__throw_logic_error("basic_string::_M_construct null not valid");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_598._M_dataplus._M_p != &local_598.field_2) {
          operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
        }
        if (local_5f0 != &local_5e0) {
          operator_delete(local_5f0,local_5e0 + 1);
        }
        if (local_518 != &local_508) {
          operator_delete(local_518,local_508 + 1);
        }
        if (local_538 != &local_528) {
          operator_delete(local_538,local_528 + 1);
        }
        if (local_558 != &local_548) {
          operator_delete(local_558,local_548 + 1);
        }
        if (local_320 != &local_310) {
          operator_delete(local_320,local_310 + 1);
        }
        if (local_340 != &local_330) {
          operator_delete(local_340,local_330 + 1);
        }
        if (local_360 != &local_350) {
          operator_delete(local_360,local_350 + 1);
        }
        if (local_380 != &local_370) {
          operator_delete(local_380,local_370 + 1);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0,local_390 + 1);
        }
        if (local_3c0 != &local_3b0) {
          operator_delete(local_3c0,local_3b0 + 1);
        }
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0 + 1);
        }
        if (local_460 != &local_450) {
          operator_delete(local_460,local_450 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
          operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != paVar3) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
        glu::ProgramSources::~ProgramSources((ProgramSources *)&uniforms);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
          operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                          glslVersionDeclaration.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)colorExpr._M_dataplus._M_p != &colorExpr.field_2) {
          operator_delete(colorExpr._M_dataplus._M_p,colorExpr.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)colorBaseExpr._M_dataplus._M_p != &colorBaseExpr.field_2) {
          operator_delete(colorBaseExpr._M_dataplus._M_p,
                          colorBaseExpr.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
          operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                          shaderImageTypeStr.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shaderImageFormatStr._M_dataplus._M_p != &shaderImageFormatStr.field_2) {
          operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                          shaderImageFormatStr.field_2._M_allocated_capacity + 1);
        }
        glu::ObjectWrapper::~ObjectWrapper(&texture.super_ObjectWrapper);
        glu::ObjectWrapper::~ObjectWrapper(&textureBuf.super_ObjectWrapper);
        glu::CallLogWrapper::~CallLogWrapper(&glLog);
        _Unwind_Resume(uVar24);
      }
      std::operator+(&local_598,"\timageStore(u_image, ivec2(gx, gy), ",&colorExpr);
      puVar22 = (undefined8 *)std::__cxx11::string::append((char *)&local_598);
      local_578 = &local_568;
      puVar29 = puVar22 + 2;
      if ((ulong *)*puVar22 == puVar29) {
        local_568 = *puVar29;
        uStack_560 = puVar22[3];
      }
      else {
        local_568 = *puVar29;
        local_578 = (ulong *)*puVar22;
      }
      local_570 = puVar22[1];
      *puVar22 = puVar29;
      bVar37 = true;
      goto LAB_0147290b;
    }
    std::operator+(&local_598,"\timageStore(u_image, ivec3(gx, gy, gz), ",&colorExpr);
    puVar22 = (undefined8 *)std::__cxx11::string::append((char *)&local_598);
    local_578 = &local_568;
    puVar29 = puVar22 + 2;
    if ((ulong *)*puVar22 == puVar29) {
      local_568 = *puVar29;
      uStack_560 = puVar22[3];
    }
    else {
      local_568 = *puVar29;
      local_578 = (ulong *)*puVar22;
    }
    local_570 = puVar22[1];
    *puVar22 = puVar29;
    bVar8 = true;
    bVar37 = false;
  }
  puVar22[1] = 0;
  *(undefined1 *)puVar29 = 0;
  uVar35 = 0xf;
  if (local_5f0 != &local_5e0) {
    uVar35 = local_5e0;
  }
  if (uVar35 < (ulong)(local_570 + local_5e8)) {
    uVar35 = 0xf;
    if (local_578 != &local_568) {
      uVar35 = local_568;
    }
    if ((ulong)(local_570 + local_5e8) <= uVar35) {
      puVar22 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_578,0,(char *)0x0,(ulong)local_5f0);
      goto LAB_014729be;
    }
  }
  puVar22 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_5f0,(ulong)local_578);
LAB_014729be:
  plVar21 = puVar22 + 2;
  if ((long *)*puVar22 == plVar21) {
    local_5c0 = *plVar21;
    uStack_5b8 = puVar22[3];
    local_5d0 = &local_5c0;
  }
  else {
    local_5c0 = *plVar21;
    local_5d0 = (long *)*puVar22;
  }
  local_5c8 = puVar22[1];
  *puVar22 = plVar21;
  puVar22[1] = 0;
  *(undefined1 *)plVar21 = 0;
  plVar21 = (long *)std::__cxx11::string::append((char *)&local_5d0);
  puVar29 = (ulong *)(plVar21 + 2);
  if ((ulong *)*plVar21 == puVar29) {
    local_600 = *puVar29;
    lStack_5f8 = plVar21[3];
    local_610 = &local_600;
  }
  else {
    local_600 = *puVar29;
    local_610 = (ulong *)*plVar21;
  }
  local_608 = plVar21[1];
  *plVar21 = (long)puVar29;
  plVar21[1] = 0;
  *(undefined1 *)(plVar21 + 2) = 0;
  res.m_data[0] = 7.00649e-45;
  res.m_data._8_8_ = local_658[0]._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(res.m_data + 2),local_610,local_608 + (long)local_610);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&uniforms.m_gl + (res.m_data._0_8_ & 0xffffffff) * 3),
              (value_type *)(res.m_data + 2));
  glu::ShaderProgram::ShaderProgram(&program,local_698,(ProgramSources *)&uniforms);
  if ((char *)res.m_data._8_8_ != local_658[0]._M_local_buf + 8) {
    operator_delete((void *)res.m_data._8_8_,local_658[0]._8_8_ + 1);
  }
  uVar35 = local_690;
  if (local_610 != &local_600) {
    operator_delete(local_610,local_600 + 1);
  }
  if (local_5d0 != &local_5c0) {
    operator_delete(local_5d0,local_5c0 + 1);
  }
  if (local_578 != &local_568) {
    operator_delete(local_578,local_568 + 1);
  }
  pTVar7 = local_5b0;
  if ((bVar8) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2)) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  if ((bVar37) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2)) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  if (((int)uVar35 == 7) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != &local_598.field_2)) {
    operator_delete(local_598._M_dataplus._M_p,local_598.field_2._M_allocated_capacity + 1);
  }
  if (local_5f0 != &local_5e0) {
    operator_delete(local_5f0,local_5e0 + 1);
  }
  if (local_518 != &local_508) {
    operator_delete(local_518,local_508 + 1);
  }
  if (local_538 != &local_528) {
    operator_delete(local_538,local_528 + 1);
  }
  if (local_558 != &local_548) {
    operator_delete(local_558,local_548 + 1);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320,local_310 + 1);
  }
  pIVar9 = local_638;
  if (local_340 != &local_330) {
    operator_delete(local_340,local_330 + 1);
  }
  if (local_360 != &local_350) {
    operator_delete(local_360,local_350 + 1);
  }
  if (local_380 != &local_370) {
    operator_delete(local_380,local_370 + 1);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,local_390 + 1);
  }
  if (local_3c0 != &local_3b0) {
    operator_delete(local_3c0,local_3b0 + 1);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,local_2d0 + 1);
  }
  if (local_460 != &local_450) {
    operator_delete(local_460,local_450 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar3) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  local_440 = &pIVar9->m_format;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1f8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_218);
  lVar32 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&uniforms.m_gl + lVar32));
    lVar32 = lVar32 + -0x18;
  } while (lVar32 != -0x18);
  iVar12 = (*local_698->_vptr_RenderContext[3])();
  uniforms.m_gl = (Functions *)CONCAT44(extraout_var_02,iVar12);
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header;
  uniforms.m_log = pTVar7;
  uniforms.m_programGL = program.m_program.m_program;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::operator<<(pTVar7,&program);
  local_690 = CONCAT71(local_690._1_7_,program.m_program.m_info.linkOk);
  if (program.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((local_638->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Program compilation failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&glLog,program.m_program.m_program);
    if (local_638->m_singleLayerBind == true) {
      if (bVar11) {
        iVar12 = local_6a8.m_data[0];
        iVar14 = local_6a8.m_data[1];
        x_00 = 0;
        do {
          if (x_00 != 0) {
            glu::CallLogWrapper::glMemoryBarrier(&glLog,0x20);
          }
          res.m_data._0_8_ = local_658;
          std::__cxx11::string::_M_construct<char_const*>((string *)&res,"u_layerNdx","");
          UniformAccessLogger::assign1i(&uniforms,(string *)&res,x_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)res.m_data._0_8_ != local_658) {
            operator_delete((void *)res.m_data._0_8_,local_658[0]._M_allocated_capacity + 1);
          }
          glu::CallLogWrapper::glBindImageTexture
                    (&glLog,0,texture.super_ObjectWrapper.m_object,0,'\0',x_00,0x88b9,dVar13);
          iVar15 = (*local_698->_vptr_RenderContext[3])();
          dVar16 = (**(code **)(CONCAT44(extraout_var_03,iVar15) + 0x800))();
          glu::checkError(dVar16,"glBindImageTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                          ,0x4cb);
          glu::CallLogWrapper::glDispatchCompute(&glLog,iVar12,iVar14,1);
          iVar15 = (*local_698->_vptr_RenderContext[3])();
          dVar16 = (**(code **)(CONCAT44(extraout_var_04,iVar15) + 0x800))();
          glu::checkError(dVar16,"glDispatchCompute",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                          ,0x4ce);
          x_00 = x_00 + 1;
        } while (local_6ac != x_00);
      }
    }
    else {
      glu::CallLogWrapper::glBindImageTexture
                (&glLog,0,texture.super_ObjectWrapper.m_object,0,'\x01',0,0x88b9,dVar13);
      iVar12 = (*local_698->_vptr_RenderContext[3])();
      dVar13 = (**(code **)(CONCAT44(extraout_var_05,iVar12) + 0x800))();
      glu::checkError(dVar13,"glBindImageTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x4d4);
      glu::CallLogWrapper::glDispatchCompute
                (&glLog,local_6a8.m_data[0],local_6a8.m_data[1],local_6ac);
      iVar12 = (*local_698->_vptr_RenderContext[3])();
      dVar13 = (**(code **)(CONCAT44(extraout_var_06,iVar12) + 0x800))();
      glu::checkError(dVar13,"glDispatchCompute",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x4d7);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&uniforms.m_uniformLocations._M_t);
  glu::ShaderProgram::~ShaderProgram(&program);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
    operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                    glslVersionDeclaration.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorExpr._M_dataplus._M_p != &colorExpr.field_2) {
    operator_delete(colorExpr._M_dataplus._M_p,colorExpr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)colorBaseExpr._M_dataplus._M_p != &colorBaseExpr.field_2) {
    operator_delete(colorBaseExpr._M_dataplus._M_p,colorBaseExpr.field_2._M_allocated_capacity + 1);
  }
  pIVar9 = local_638;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
    operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                    shaderImageTypeStr.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageFormatStr._M_dataplus._M_p != &shaderImageFormatStr.field_2) {
    operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                    shaderImageFormatStr.field_2._M_allocated_capacity + 1);
  }
  if ((char)local_690 != '\0') {
    CVar4 = (pIVar9->m_format).type;
    if ((0x21 < (ulong)CVar4) || (bVar37 = true, (0x2c0000000U >> ((ulong)CVar4 & 0x3f) & 1) == 0))
    {
      bVar37 = CVar4 - SIGNED_INT8 < 3;
    }
    local_438 = local_6a8.m_data._0_8_ & 0xffffffff;
    local_5b0 = (TestLog *)CONCAT44(local_5b0._4_4_,local_6a8.m_data[1]);
    LayeredImage::LayeredImage
              ((LayeredImage *)&program,pIVar9->m_textureType,local_440,local_6a8.m_data[0],
               local_6a8.m_data[1],local_6a8.m_data[2]);
    if (bVar11) {
      local_5a8._4_4_ = local_5a8._0_4_;
      fStack_5a0 = (float)local_5a8._0_4_;
      fStack_59c = (float)local_5a8._0_4_;
      uVar17 = (uint)local_438;
      local_690 = CONCAT44(local_690._4_4_,-uVar17);
      z = 0;
      do {
        if (0 < (int)(uint)local_5b0) {
          y = 0;
          do {
            if (0 < (int)local_438) {
              uVar36 = ~y + (uint)local_5b0 ^ z;
              x = 0;
              uVar31 = uVar17;
              do {
                uVar31 = uVar31 - 1;
                uVar18 = y ^ z ^ x;
                uVar25 = y ^ z ^ uVar31;
                uVar30 = uVar36 ^ x;
                uVar33 = uVar36 ^ uVar31;
                uniforms.m_gl = (Functions *)CONCAT44(uVar25,uVar18);
                uniforms.m_log = (TestLog *)CONCAT44(uVar33,uVar30);
                if (bVar37) {
                  Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
                            ((LayeredImage *)&program,x,y,z,(Vector<int,_4> *)&uniforms);
                }
                else {
                  res.m_data[1] = (float)(int)uVar25 * (float)local_5a8._4_4_ + fVar38;
                  res.m_data[0] = (float)(int)uVar18 * (float)local_5a8._0_4_ + fVar38;
                  res.m_data[3] = (float)(int)uVar33 * fStack_59c + fVar38;
                  res.m_data[2] = (float)(int)uVar30 * fStack_5a0 + fVar38;
                  Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<float,4>>
                            ((LayeredImage *)&program,x,y,z,&res);
                }
                x = x + 1;
              } while ((int)local_690 + x != 0);
            }
            y = y + 1;
          } while (y != (uint)local_5b0);
        }
        z = z + 1;
      } while (z != local_6ac);
    }
    pIVar9 = local_638;
    uniforms.m_gl = (Functions *)&PTR_operator___02162e60;
    uniforms.m_log = (TestLog *)&program;
    uniforms._20_4_ =
         program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
         _M_impl.super__Vector_impl_data._M_finish._0_4_;
    uniforms.m_programGL =
         program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
         _M_impl.super__Vector_impl_data._M_start._4_4_;
    bVar11 = readTextureAndVerify
                       (local_698,&glLog,texture.super_ObjectWrapper.m_object,
                        textureBuf.super_ObjectWrapper.m_object,local_638->m_textureType,local_440,
                        &local_6a8,(ImageLayerVerifier *)&uniforms);
    pcVar23 = "Image comparison failed";
    if (bVar11) {
      pcVar23 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((pIVar9->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar11,
               pcVar23);
    LayeredImage::~LayeredImage((LayeredImage *)&program);
  }
  glu::ObjectWrapper::~ObjectWrapper(&texture.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&textureBuf.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&glLog);
  return STOP;
}

Assistant:

ImageStoreCase::IterateResult ImageStoreCase::iterate (void)
{
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	TestLog&					log						(m_testCtx.getLog());
	glu::CallLogWrapper			glLog					(renderCtx.getFunctions(), log);
	const deUint32				internalFormatGL		= glu::getInternalFormat(m_format);
	const deUint32				textureTargetGL			= getGLTextureTarget(m_textureType);
	const IVec3&				imageSize				= defaultImageSize(m_textureType);
	const int					numSlicesOrFaces		= m_textureType == TEXTURETYPE_CUBE ? 6 : imageSize.z();
	const int					maxImageDimension		= de::max(imageSize.x(), de::max(imageSize.y(), imageSize.z()));
	const float					storeColorScale			= isFormatTypeUnorm(m_format.type) ? 1.0f / (float)(maxImageDimension - 1)
														: isFormatTypeSnorm(m_format.type) ? 2.0f / (float)(maxImageDimension - 1)
														: 1.0f;
	const float					storeColorBias			= isFormatTypeSnorm(m_format.type) ? -1.0f : 0.0f;
	const glu::Buffer			textureBuf				(renderCtx); // \note Only really used if using buffer texture.
	const glu::Texture			texture					(renderCtx);

	glLog.enableLogging(true);

	// Setup texture.

	log << TestLog::Message << "// Created a texture (name " << *texture << ")" << TestLog::EndMessage;
	if (m_textureType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created a buffer for the texture (name " << *textureBuf << ")" << TestLog::EndMessage;

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(textureTargetGL, *texture);
	setTexParameteri(glLog, textureTargetGL);
	setTextureStorage(glLog, m_textureType, internalFormatGL, imageSize, *textureBuf);

	// Perform image stores in compute shader.

	{
		// Generate compute shader.

		const string		shaderImageFormatStr	= getShaderImageFormatQualifier(m_format);
		const TextureType	shaderImageType			= m_singleLayerBind ? textureLayerType(m_textureType) : m_textureType;
		const string		shaderImageTypeStr		= getShaderImageType(m_format.type, shaderImageType);
		const bool			isUintFormat			= isFormatTypeUnsignedInteger(m_format.type);
		const bool			isIntFormat				= isFormatTypeSignedInteger(m_format.type);
		const string		colorBaseExpr			= string(isUintFormat ? "u" : isIntFormat ? "i" : "") + "vec4(gx^gy^gz, "
																												 "(" + toString(imageSize.x()-1) + "-gx)^gy^gz, "
																												 "gx^(" + toString(imageSize.y()-1) + "-gy)^gz, "
																												 "(" + toString(imageSize.x()-1) + "-gx)^(" + toString(imageSize.y()-1) + "-gy)^gz)";
		const string		colorExpr				= colorBaseExpr + (storeColorScale == 1.0f ? "" : "*" + toString(storeColorScale))
																	+ (storeColorBias == 0.0f ? "" : " + float(" + toString(storeColorBias) + ")");
		const std::string	glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ textureTypeExtensionShaderRequires(shaderImageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) writeonly uniform " + shaderImageTypeStr + " u_image;\n"
														+ (m_singleLayerBind ? "uniform int u_layerNdx;\n" : "") +
														"\n"
														"void main (void)\n"
														"{\n"
														"	int gx = int(gl_GlobalInvocationID.x);\n"
														"	int gy = int(gl_GlobalInvocationID.y);\n"
														"	int gz = " + (m_singleLayerBind ? "u_layerNdx" : "int(gl_GlobalInvocationID.z)") + ";\n"
														+ (shaderImageType == TEXTURETYPE_BUFFER ?
															"	imageStore(u_image, gx, " + colorExpr + ");\n"
														 : shaderImageType == TEXTURETYPE_2D ?
															"	imageStore(u_image, ivec2(gx, gy), " + colorExpr + ");\n"
														 : shaderImageType == TEXTURETYPE_3D || shaderImageType == TEXTURETYPE_CUBE || shaderImageType == TEXTURETYPE_2D_ARRAY ?
															"	imageStore(u_image, ivec3(gx, gy, gz), " + colorExpr + ");\n"
														 : DE_NULL) +
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		if (m_singleLayerBind)
		{
			for (int layerNdx = 0; layerNdx < numSlicesOrFaces; layerNdx++)
			{
				if (layerNdx > 0)
					glLog.glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

				uniforms.assign1i("u_layerNdx", layerNdx);

				glLog.glBindImageTexture(0, *texture, 0, GL_FALSE, layerNdx, GL_WRITE_ONLY, internalFormatGL);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

				glLog.glDispatchCompute(imageSize.x(), imageSize.y(), 1);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
			}
		}
		else
		{
			glLog.glBindImageTexture(0, *texture, 0, GL_TRUE, 0, GL_WRITE_ONLY, internalFormatGL);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

			glLog.glDispatchCompute(imageSize.x(), imageSize.y(), numSlicesOrFaces);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
		}
	}

	// Create reference, read texture and compare to reference.
	{
		const int		isIntegerFormat		= isFormatTypeInteger(m_format.type);
		LayeredImage	reference			(m_textureType, m_format, imageSize.x(), imageSize.y(), imageSize.z());

		DE_ASSERT(!isIntegerFormat || (storeColorScale == 1.0f && storeColorBias == 0.0f));

		for (int z = 0; z < numSlicesOrFaces; z++)
		for (int y = 0; y < imageSize.y(); y++)
		for (int x = 0; x < imageSize.x(); x++)
		{
			const IVec4 color(x^y^z, (imageSize.x()-1-x)^y^z, x^(imageSize.y()-1-y)^z, (imageSize.x()-1-x)^(imageSize.y()-1-y)^z);

			if (isIntegerFormat)
				reference.setPixel(x, y, z, color);
			else
				reference.setPixel(x, y, z, color.asFloat()*storeColorScale + storeColorBias);
		}

		const bool compareOk = readTextureAndVerify(renderCtx, glLog, *texture, *textureBuf, m_textureType, m_format, imageSize, ImageLayerComparer(reference));

		m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, compareOk ? "Pass" : "Image comparison failed");
		return STOP;
	}
}